

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_act.c
# Opt level: O3

bool aedit_name(CHAR_DATA *ch,char *argument)

{
  char cVar1;
  void *pvVar2;
  char *pcVar3;
  
  cVar1 = *argument;
  if (cVar1 == '\0') {
    pcVar3 = "Syntax:   name [$name]\n\r";
  }
  else {
    pvVar2 = ch->desc->pEdit;
    free_pstring(*(char **)((long)pvVar2 + 0x40));
    pcVar3 = palloc_string(argument);
    *(char **)((long)pvVar2 + 0x40) = pcVar3;
    pcVar3 = "Name set.\n\r";
  }
  send_to_char(pcVar3,ch);
  return cVar1 != '\0';
}

Assistant:

bool aedit_name(CHAR_DATA *ch, char *argument)
{
	AREA_DATA *pArea;

	EDIT_AREA(ch, pArea);

	if (argument[0] == '\0')
	{
		send_to_char("Syntax:   name [$name]\n\r", ch);
		return false;
	}

	free_pstring(pArea->name);
	pArea->name = palloc_string(argument);

	send_to_char("Name set.\n\r", ch);
	return true;
}